

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<Fad<double>_>::SolveEigenvaluesJacobi
          (TPZMatrix<Fad<double>_> *this,int64_t *numiterations,REAL *tol,TPZVec<Fad<double>_> *Sort
          )

{
  uint uVar1;
  Fad<double> *pFVar2;
  undefined8 uVar3;
  _Rb_tree_color _Var4;
  TPZVec<Fad<double>_> *pTVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _Base_ptr *pp_Var8;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  double *pdVar9;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  _Base_ptr p_Var10;
  _Self __tmp;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  Fad<double> exps;
  multiset<double,_std::less<double>,_std::allocator<double>_> myset;
  Fad<double> sint;
  Fad<double> cost;
  Fad<double> maxval;
  Fad<double> Spq;
  Fad<double> aux2;
  Fad<double> aux;
  Fad<double> Sqq;
  Fad<double> Spp;
  Fad<double> theta;
  undefined1 local_2a0 [16];
  MEM_CPY<double> *local_290;
  _Base_ptr p_Stack_288;
  undefined1 local_280 [8];
  _Rb_tree_node_base local_278;
  size_t local_258;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  Fad<double> local_230;
  undefined1 local_210 [16];
  undefined1 *local_200;
  undefined1 local_1f8 [16];
  Fad<double> local_1e8;
  long local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [16];
  Fad<double> *local_1a0;
  _Base_ptr local_198;
  undefined8 uStack_190;
  long *local_188;
  Fad<double> local_180;
  TPZVec<Fad<double>_> *local_160;
  double *local_158;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_150;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> local_140;
  Fad<double> local_130;
  Fad<double> local_110;
  Fad<double> local_f0;
  Fad<double> local_d0;
  Fad<double> local_b0;
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> local_50;
  undefined4 extraout_var_08;
  
  local_280 = (undefined1  [8])0x4000000000000000;
  local_278._0_8_ = local_278._0_8_ & 0xffffffff00000000;
  local_278._M_parent = (_Base_ptr)0x0;
  local_278._M_left = (_Rb_tree_node_base *)0x0;
  local_2a0._0_8_ = *tol;
  local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffff00000000;
  local_290 = (MEM_CPY<double> *)0x0;
  p_Stack_288 = (_Base_ptr)0x0;
  local_d0.val_ = (double)local_2a0._0_8_ + (double)local_2a0._0_8_;
  local_d0.dx_.num_elts = 0;
  local_d0.dx_.ptr_to_data = (double *)0x0;
  local_d0.defaultVal = 0.0;
  local_188 = numiterations;
  local_160 = Sort;
  local_158 = tol;
  Fad<double>::~Fad((Fad<double> *)local_2a0);
  Fad<double>::~Fad((Fad<double> *)local_280);
  uVar13 = (this->super_TPZBaseMatrix).fRow;
  Fad<double>::Fad(&local_180);
  Fad<double>::Fad(&local_50);
  Fad<double>::Fad(&local_1e8);
  Fad<double>::Fad(&local_230);
  Fad<double>::Fad(&local_f0);
  Fad<double>::Fad(&local_110);
  Fad<double>::Fad(&local_70);
  Fad<double>::Fad(&local_90);
  Fad<double>::Fad(&local_130);
  local_1c0 = uVar13;
  if (*local_188 < 1) {
    lVar16 = 0;
  }
  else {
    lVar16 = 0;
    uVar11 = 0xffffffffffffffff;
    uVar14 = 0xffffffffffffffff;
    do {
      local_180.val_ = 0.0;
      if (local_180.dx_.num_elts != 0) {
        local_280 = (undefined1  [8])0x0;
        Vector<double>::operator=(&local_180.dx_,(double *)local_280);
      }
      local_1c8 = lVar16;
      if (0 < (long)uVar13) {
        uVar15 = 0;
        do {
          if (uVar15 != 0) {
            uVar12 = 0;
            do {
              if (((this->super_TPZBaseMatrix).fRow <= (long)uVar15) ||
                 ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)) {
                Error("TPZMatrix<TVar>::Operator()","Index out of range");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                           ,0x33d);
              }
              iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                                (this,uVar15,uVar12);
              if (ABS(local_180.val_) < ABS(*(double *)CONCAT44(extraout_var,iVar6))) {
                if (((this->super_TPZBaseMatrix).fRow <= (long)uVar15) ||
                   ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)) {
                  Error("TPZMatrix<TVar>::Operator()","Index out of range");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                             ,0x33d);
                }
                iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                                  (this,uVar15,uVar12);
                local_180.val_ = ABS(*(double *)CONCAT44(extraout_var_00,iVar6));
                uVar11 = uVar12;
                uVar14 = uVar15;
                if (local_180.dx_.num_elts != 0) {
                  local_280 = (undefined1  [8])0x0;
                  Vector<double>::operator=(&local_180.dx_,(double *)local_280);
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar15 != uVar12);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar13);
      }
      local_d0.val_ = local_180.val_;
      Vector<double>::operator=(&local_d0.dx_,&local_180.dx_);
      local_d0.defaultVal = local_180.defaultVal;
      lVar16 = local_1c8;
      if (ABS(local_d0.val_) < *local_158) break;
      local_280 = (undefined1  [8])0x3fe0000000000000;
      local_278._0_8_ = local_278._0_8_ & 0xffffffff00000000;
      local_278._M_parent = (_Base_ptr)0x0;
      local_278._M_left = (_Base_ptr)0x0;
      local_2a0._0_8_ =
           (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
            *)0x4000000000000000;
      local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffff00000000;
      local_290 = (MEM_CPY<double> *)0x0;
      p_Stack_288 = (_Base_ptr)0x0;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)(uVar11 | uVar14) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar14,uVar11);
      local_250._8_8_ = CONCAT44(extraout_var_01,iVar6);
      local_250._0_8_ = (Fad<double> *)local_2a0;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar11) || ((long)uVar11 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar11,uVar11);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)uVar14 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar14)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar14,uVar14);
      local_1f8._8_8_ = CONCAT44(extraout_var_03,iVar7);
      local_210._8_8_ = local_250;
      local_200 = local_1f8;
      local_240._8_8_ = local_210;
      local_240._0_8_ = (Fad<double> *)local_280;
      local_1f8._0_8_ = (Fad<double> *)CONCAT44(extraout_var_02,iVar6);
      Fad<double>::operator=
                (&local_50,
                 (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)local_240);
      Fad<double>::~Fad((Fad<double> *)local_2a0);
      Fad<double>::~Fad((Fad<double> *)local_280);
      FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_2a0,&local_50);
      FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_280,
                 (FadFuncCos<Fad<double>_> *)local_2a0);
      Fad<double>::~Fad((Fad<double> *)local_2a0);
      _Var4 = (_Rb_tree_color)local_278._M_parent;
      uVar13 = (ulong)local_278._M_parent & 0xffffffff;
      if ((_Rb_tree_color)local_278._M_parent != local_1e8.dx_.num_elts) {
        if ((_Rb_tree_color)local_278._M_parent == _S_red) {
          if (local_1e8.dx_.num_elts != _S_red) {
            if ((EVP_PKEY_CTX *)local_1e8.dx_.ptr_to_data != (EVP_PKEY_CTX *)0x0) {
              operator_delete__(local_1e8.dx_.ptr_to_data);
            }
            local_1e8.dx_.num_elts = _S_red;
            local_1e8.dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          if (local_1e8.dx_.num_elts != _S_red) {
            if ((EVP_PKEY_CTX *)local_1e8.dx_.ptr_to_data != (EVP_PKEY_CTX *)0x0) {
              operator_delete__(local_1e8.dx_.ptr_to_data);
            }
            local_1e8.dx_.ptr_to_data = (double *)0x0;
          }
          local_1e8.dx_.num_elts = _Var4;
          uVar15 = (long)(int)_Var4 << 3;
          if ((int)_Var4 < 0) {
            uVar15 = 0xffffffffffffffff;
          }
          local_1e8.dx_.ptr_to_data = (double *)operator_new__(uVar15);
        }
      }
      pdVar9 = local_1e8.dx_.ptr_to_data;
      if (_Var4 != _S_red) {
        if ((_Rb_tree_color)local_278._M_parent == 0) {
          if (0 < (int)_Var4) {
            lVar16 = 0;
            do {
              pp_Var8 = (_Base_ptr *)((long)&(local_278._M_left)->_M_color + lVar16);
              if ((_Rb_tree_color)local_278._M_parent == 0) {
                pp_Var8 = &local_278._M_right;
              }
              local_198 = (_Base_ptr)((ulong)*pp_Var8 ^ 0x8000000000000000);
              uStack_190 = 0x8000000000000000;
              dVar17 = sin((double)local_278._0_8_);
              *(double *)((long)pdVar9 + lVar16) = dVar17 * (double)local_198;
              lVar16 = lVar16 + 8;
            } while (uVar13 * 8 - lVar16 != 0);
          }
        }
        else if (0 < (int)_Var4) {
          uVar15 = 0;
          do {
            local_198 = (_Base_ptr)
                        (*(ulong *)(&(local_278._M_left)->_M_color + uVar15 * 2) ^
                        0x8000000000000000);
            uStack_190 = 0x8000000000000000;
            dVar17 = sin((double)local_278._0_8_);
            *(double *)((long)pdVar9 + uVar15 * 8) = dVar17 * (double)local_198;
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
        }
      }
      local_1e8.val_ = cos((double)local_278._0_8_);
      Fad<double>::~Fad((Fad<double> *)&local_278);
      FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_2a0,&local_50);
      FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_280,
                 (FadFuncSin<Fad<double>_> *)local_2a0);
      Fad<double>::~Fad((Fad<double> *)local_2a0);
      uVar1 = (_Rb_tree_color)local_278._M_parent;
      uVar13 = (ulong)local_278._M_parent & 0xffffffff;
      if ((_Rb_tree_color)local_278._M_parent != local_230.dx_.num_elts) {
        if ((_Rb_tree_color)local_278._M_parent == 0) {
          if (local_230.dx_.num_elts != 0) {
            if ((EVP_PKEY_CTX *)local_230.dx_.ptr_to_data != (EVP_PKEY_CTX *)0x0) {
              operator_delete__(local_230.dx_.ptr_to_data);
            }
            local_230.dx_.num_elts = 0;
            local_230.dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          if (local_230.dx_.num_elts != 0) {
            if ((EVP_PKEY_CTX *)local_230.dx_.ptr_to_data != (EVP_PKEY_CTX *)0x0) {
              operator_delete__(local_230.dx_.ptr_to_data);
            }
            local_230.dx_.ptr_to_data = (double *)0x0;
          }
          local_230.dx_.num_elts = uVar1;
          uVar15 = (long)(int)uVar1 << 3;
          if ((int)uVar1 < 0) {
            uVar15 = 0xffffffffffffffff;
          }
          local_230.dx_.ptr_to_data = (double *)operator_new__(uVar15);
        }
      }
      pdVar9 = local_230.dx_.ptr_to_data;
      if (uVar1 != 0) {
        if ((_Rb_tree_color)local_278._M_parent == 0) {
          if (0 < (int)uVar1) {
            lVar16 = 0;
            do {
              pp_Var8 = (_Base_ptr *)((long)&(local_278._M_left)->_M_color + lVar16);
              if ((_Rb_tree_color)local_278._M_parent == 0) {
                pp_Var8 = &local_278._M_right;
              }
              local_198 = *pp_Var8;
              dVar17 = cos((double)local_278._0_8_);
              *(double *)((long)pdVar9 + lVar16) = dVar17 * (double)local_198;
              lVar16 = lVar16 + 8;
            } while (uVar13 * 8 - lVar16 != 0);
          }
        }
        else if (0 < (int)uVar1) {
          uVar15 = 0;
          do {
            local_198 = *(_Base_ptr *)(&(local_278._M_left)->_M_color + uVar15 * 2);
            dVar17 = cos((double)local_278._0_8_);
            *(double *)((long)pdVar9 + uVar15 * 8) = dVar17 * (double)local_198;
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
        }
      }
      local_230.val_ = sin((double)local_278._0_8_);
      Fad<double>::~Fad((Fad<double> *)&local_278);
      uVar13 = local_1c0;
      if (0 < (long)local_1c0) {
        uVar15 = 0;
        do {
          if ((uVar14 != uVar15) && (uVar11 != uVar15)) {
            if (((this->super_TPZBaseMatrix).fRow <= (long)uVar15) ||
               (((long)uVar14 < 0 || ((this->super_TPZBaseMatrix).fCol <= (long)uVar14)))) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar15,uVar14);
            iVar6 = local_1e8.dx_.num_elts;
            local_280 = (undefined1  [8])local_1e8.val_;
            local_278._M_color = local_1e8.dx_.num_elts;
            local_278._M_parent = (_Base_ptr)0x0;
            if ((long)local_1e8.dx_.num_elts != 0) {
              uVar13 = (long)local_1e8.dx_.num_elts * 8;
              if (local_1e8.dx_.num_elts < 0) {
                uVar13 = 0xffffffffffffffff;
              }
              local_278._M_parent = (_Base_ptr)operator_new__(uVar13);
              MEM_CPY<double>::copy
                        ((MEM_CPY<double> *)local_278._M_parent,
                         (EVP_PKEY_CTX *)local_1e8.dx_.ptr_to_data,
                         (EVP_PKEY_CTX *)(ulong)(uint)iVar6);
            }
            local_278._M_left = (_Base_ptr)local_1e8.defaultVal;
            local_240._8_8_ = local_280;
            local_240._0_8_ = (Fad<double> *)CONCAT44(extraout_var_04,iVar7);
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar11 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar15,uVar11);
            iVar6 = local_230.dx_.num_elts;
            local_2a0._0_8_ = local_230.val_;
            local_2a0._8_4_ = local_230.dx_.num_elts;
            local_290 = (MEM_CPY<double> *)0x0;
            if ((long)local_230.dx_.num_elts != 0) {
              uVar13 = (long)local_230.dx_.num_elts * 8;
              if (local_230.dx_.num_elts < 0) {
                uVar13 = 0xffffffffffffffff;
              }
              local_290 = (MEM_CPY<double> *)operator_new__(uVar13);
              MEM_CPY<double>::copy
                        (local_290,(EVP_PKEY_CTX *)local_230.dx_.ptr_to_data,
                         (EVP_PKEY_CTX *)(ulong)(uint)iVar6);
            }
            p_Stack_288 = (_Base_ptr)local_230.defaultVal;
            local_210._0_8_ = local_240;
            local_210._8_8_ = local_250;
            local_250._0_8_ = (Fad<double> *)CONCAT44(extraout_var_05,iVar7);
            local_250._8_8_ = (Fad<double> *)local_2a0;
            Fad<double>::operator=
                      (&local_f0,
                       (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                        *)local_210);
            Fad<double>::~Fad((Fad<double> *)local_2a0);
            Fad<double>::~Fad((Fad<double> *)local_280);
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar14 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar14)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar15,uVar14);
            iVar6 = local_230.dx_.num_elts;
            local_280 = (undefined1  [8])local_230.val_;
            local_278._M_color = local_230.dx_.num_elts;
            local_278._M_parent = (_Base_ptr)0x0;
            if ((long)local_230.dx_.num_elts != 0) {
              uVar13 = (long)local_230.dx_.num_elts * 8;
              if (local_230.dx_.num_elts < 0) {
                uVar13 = 0xffffffffffffffff;
              }
              local_278._M_parent = (_Base_ptr)operator_new__(uVar13);
              MEM_CPY<double>::copy
                        ((MEM_CPY<double> *)local_278._M_parent,
                         (EVP_PKEY_CTX *)local_230.dx_.ptr_to_data,
                         (EVP_PKEY_CTX *)(ulong)(uint)iVar6);
            }
            local_278._M_left = (_Base_ptr)local_230.defaultVal;
            local_240._8_8_ = local_280;
            local_240._0_8_ = (Fad<double> *)CONCAT44(extraout_var_06,iVar7);
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar11 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar15,uVar11);
            iVar6 = local_1e8.dx_.num_elts;
            local_2a0._0_8_ = local_1e8.val_;
            local_2a0._8_4_ = local_1e8.dx_.num_elts;
            local_290 = (MEM_CPY<double> *)0x0;
            if ((long)local_1e8.dx_.num_elts != 0) {
              uVar13 = (long)local_1e8.dx_.num_elts * 8;
              if (local_1e8.dx_.num_elts < 0) {
                uVar13 = 0xffffffffffffffff;
              }
              local_290 = (MEM_CPY<double> *)operator_new__(uVar13);
              MEM_CPY<double>::copy
                        (local_290,(EVP_PKEY_CTX *)local_1e8.dx_.ptr_to_data,
                         (EVP_PKEY_CTX *)(ulong)(uint)iVar6);
            }
            p_Stack_288 = (_Base_ptr)local_1e8.defaultVal;
            local_210._0_8_ = local_240;
            local_210._8_8_ = local_250;
            local_250._0_8_ = (Fad<double> *)CONCAT44(extraout_var_07,iVar7);
            local_250._8_8_ = (Fad<double> *)local_2a0;
            Fad<double>::operator=
                      (&local_110,
                       (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                        *)local_210);
            Fad<double>::~Fad((Fad<double> *)local_2a0);
            Fad<double>::~Fad((Fad<double> *)local_280);
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar14 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar14)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar15,uVar14);
            pdVar9 = (double *)CONCAT44(extraout_var_08,iVar6);
            *pdVar9 = local_f0.val_;
            Vector<double>::operator=((Vector<double> *)(pdVar9 + 1),&local_f0.dx_);
            pdVar9[3] = local_f0.defaultVal;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)uVar14 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar14,uVar15);
            pdVar9 = (double *)CONCAT44(extraout_var_09,iVar6);
            *pdVar9 = local_f0.val_;
            Vector<double>::operator=((Vector<double> *)(pdVar9 + 1),&local_f0.dx_);
            pdVar9[3] = local_f0.defaultVal;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar11 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar15,uVar11);
            pdVar9 = (double *)CONCAT44(extraout_var_10,iVar6);
            *pdVar9 = local_110.val_;
            Vector<double>::operator=((Vector<double> *)(pdVar9 + 1),&local_110.dx_);
            pdVar9[3] = local_110.defaultVal;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar11) || ((long)uVar11 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar11,uVar15);
            pdVar9 = (double *)CONCAT44(extraout_var_11,iVar6);
            *pdVar9 = local_110.val_;
            Vector<double>::operator=((Vector<double> *)(pdVar9 + 1),&local_110.dx_);
            pdVar9[3] = local_110.defaultVal;
            uVar13 = local_1c0;
          }
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)uVar14 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar14)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar14,uVar14);
      local_250._0_8_ = CONCAT44(extraout_var_12,iVar6);
      local_240._0_8_ = local_250;
      local_280 = (undefined1  [8])0x4000000000000000;
      local_278._0_8_ = local_278._0_8_ & 0xffffffff00000000;
      local_278._M_parent = (_Base_ptr)0x0;
      local_278._M_left = (_Base_ptr)0x0;
      local_250._8_8_ = &local_1e8;
      local_240._8_8_ = &local_1e8;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)(uVar11 | uVar14) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      local_1b0._0_4_ =
           (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                     (this,uVar14,uVar11);
      local_1b0._4_4_ = extraout_var_13;
      local_1b0._8_8_ = local_1b8;
      local_1a0 = &local_230;
      local_1f8._0_8_ = local_1b0 + 8;
      local_210._0_8_ = local_240;
      local_210._8_8_ = local_1f8;
      local_1f8._8_8_ = &local_1e8;
      local_1b8 = (undefined1  [8])local_280;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar11) || ((long)uVar11 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar11,uVar11);
      local_150.fadexpr_.left_ = (Fad<double> *)CONCAT44(extraout_var_14,iVar6);
      local_150.fadexpr_.right_ = &local_230;
      local_140.fadexpr_.left_ = &local_150;
      local_2a0._0_8_ = local_210;
      local_2a0._8_8_ = &local_140;
      local_140.fadexpr_.right_ = local_150.fadexpr_.right_;
      Fad<double>::operator=
                (&local_70,
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)local_2a0);
      Fad<double>::~Fad((Fad<double> *)local_280);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)uVar14 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar14)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar14,uVar14);
      local_250._0_8_ = CONCAT44(extraout_var_15,iVar6);
      local_250._8_8_ = &local_230;
      local_240._0_8_ = local_250;
      local_280 = (undefined1  [8])0x4000000000000000;
      local_278._0_8_ = local_278._0_8_ & 0xffffffff00000000;
      local_278._M_parent = (_Base_ptr)0x0;
      local_278._M_left = (_Rb_tree_node_base *)0x0;
      local_240._8_8_ = local_250._8_8_;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)(uVar11 | uVar14) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      local_1b0._0_4_ =
           (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                     (this,uVar14,uVar11);
      local_1b0._4_4_ = extraout_var_16;
      local_1b0._8_8_ = local_1b8;
      local_1a0 = &local_230;
      local_1f8._0_8_ = local_1b0 + 8;
      local_210._0_8_ = local_240;
      local_210._8_8_ = local_1f8;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar11) || ((long)uVar11 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
        local_1f8._8_8_ = &local_1e8;
        local_1b8 = (undefined1  [8])local_280;
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      local_1f8._8_8_ = &local_1e8;
      local_1b8 = (undefined1  [8])local_280;
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar11,uVar11);
      local_150.fadexpr_.left_ = (Fad<double> *)CONCAT44(extraout_var_17,iVar6);
      local_140.fadexpr_.left_ = &local_150;
      local_2a0._0_8_ = local_210;
      local_2a0._8_8_ = &local_140;
      local_150.fadexpr_.right_ = &local_1e8;
      local_140.fadexpr_.right_ = &local_1e8;
      Fad<double>::operator=
                (&local_90,
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)local_2a0);
      Fad<double>::~Fad((Fad<double> *)local_280);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)uVar14 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar14)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar14,uVar14);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar11) || ((long)uVar11 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar11,uVar11);
      local_240._8_8_ = CONCAT44(extraout_var_19,iVar7);
      local_210._0_8_ = local_240;
      local_2a0._0_8_ = local_210;
      local_2a0._8_8_ = &local_230;
      local_240._0_8_ = (Fad<double> *)CONCAT44(extraout_var_18,iVar6);
      local_210._8_8_ = &local_1e8;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)(uVar11 | uVar14) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar14,uVar11);
      local_250._0_8_ = CONCAT44(extraout_var_20,iVar6);
      local_1b8 = (undefined1  [8])&local_230;
      local_1f8._0_8_ = local_1b0 + 8;
      local_1f8._8_8_ = local_1b8;
      local_250._8_8_ = local_1f8;
      local_280 = (undefined1  [8])local_2a0;
      local_278._0_8_ = local_250;
      local_1b0._0_8_ = local_1b8;
      local_1b0._8_8_ = &local_1e8;
      local_1a0 = &local_1e8;
      Fad<double>::operator=
                (&local_130,
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)local_280);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)uVar14 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar14)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar14,uVar14);
      pdVar9 = (double *)CONCAT44(extraout_var_21,iVar6);
      *pdVar9 = local_70.val_;
      Vector<double>::operator=((Vector<double> *)(pdVar9 + 1),&local_70.dx_);
      pdVar9[3] = local_70.defaultVal;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar11) || ((long)uVar11 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar11,uVar11);
      pdVar9 = (double *)CONCAT44(extraout_var_22,iVar6);
      *pdVar9 = local_90.val_;
      Vector<double>::operator=((Vector<double> *)(pdVar9 + 1),&local_90.dx_);
      pdVar9[3] = local_90.defaultVal;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar14) || ((long)(uVar11 | uVar14) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar11)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar14,uVar11);
      pdVar9 = (double *)CONCAT44(extraout_var_23,iVar6);
      *pdVar9 = local_130.val_;
      Vector<double>::operator=((Vector<double> *)(pdVar9 + 1),&local_130.dx_);
      pdVar9[3] = local_130.defaultVal;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar11) || ((long)(uVar11 | uVar14) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar14)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar11,uVar14);
      pdVar9 = (double *)CONCAT44(extraout_var_24,iVar6);
      *pdVar9 = local_130.val_;
      Vector<double>::operator=((Vector<double> *)(pdVar9 + 1),&local_130.dx_);
      pdVar9[3] = local_130.defaultVal;
      lVar16 = local_1c8 + 1;
    } while (lVar16 < *local_188);
  }
  if (local_160 != (TPZVec<Fad<double>_> *)0x0) {
    local_278._M_left = &local_278;
    local_278._0_8_ = local_278._0_8_ & 0xffffffff00000000;
    local_278._M_parent = (_Base_ptr)0x0;
    local_258 = 0;
    local_278._M_right = local_278._M_left;
    local_1c8 = lVar16;
    if (0 < (long)uVar13) {
      uVar13 = 0;
      do {
        if (((this->super_TPZBaseMatrix).fRow <= (long)uVar13) ||
           ((this->super_TPZBaseMatrix).fCol <= (long)uVar13)) {
          Error("TPZMatrix<TVar>::Operator()","Index out of range");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                     ,0x33d);
        }
        iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,uVar13,uVar13);
        pdVar9 = (double *)CONCAT44(extraout_var_25,iVar6);
        local_2a0._0_8_ = *pdVar9;
        uVar1 = *(uint *)(pdVar9 + 1);
        local_2a0._8_4_ = uVar1;
        local_290 = (MEM_CPY<double> *)0x0;
        if ((long)(int)uVar1 != 0) {
          uVar11 = 0xffffffffffffffff;
          if (-1 < (int)uVar1) {
            uVar11 = (long)(int)uVar1 * 8;
          }
          local_290 = (MEM_CPY<double> *)operator_new__(uVar11);
          MEM_CPY<double>::copy(local_290,(EVP_PKEY_CTX *)pdVar9[2],(EVP_PKEY_CTX *)(ulong)uVar1);
        }
        uVar3 = local_2a0._8_8_;
        p_Stack_288 = (_Base_ptr)pdVar9[3];
        local_b0.val_ = (double)local_2a0._0_8_;
        local_b0.dx_.num_elts = local_2a0._8_4_;
        local_b0.dx_.ptr_to_data = (double *)0x0;
        if ((long)(int)local_2a0._8_4_ != 0) {
          uVar11 = (long)(int)local_2a0._8_4_ * 8;
          if ((int)local_2a0._8_4_ < 0) {
            uVar11 = 0xffffffffffffffff;
          }
          local_b0.dx_.ptr_to_data = (double *)operator_new__(uVar11);
          MEM_CPY<double>::copy
                    ((MEM_CPY<double> *)local_b0.dx_.ptr_to_data,(EVP_PKEY_CTX *)local_290,
                     (EVP_PKEY_CTX *)(uVar3 & 0xffffffff));
        }
        local_b0.defaultVal = (double)p_Stack_288;
        local_210._0_8_ = local_b0.val_;
        std::
        _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
        ::_M_insert_equal<double>
                  ((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
                    *)local_280,(double *)local_210);
        Fad<double>::~Fad(&local_b0);
        Fad<double>::~Fad((Fad<double> *)local_2a0);
        uVar13 = uVar13 + 1;
      } while (local_1c0 != uVar13);
    }
    pTVar5 = local_160;
    uVar13 = local_1c0;
    (*local_160->_vptr_TPZVec[3])(local_160,local_1c0);
    if (local_278._M_left != &local_278) {
      lVar16 = uVar13 * 0x20 + -0x18;
      p_Var10 = local_278._M_left;
      do {
        pFVar2 = pTVar5->fStore;
        *(undefined8 *)((long)pFVar2 + lVar16 + -8) = *(undefined8 *)(p_Var10 + 1);
        if (*(int *)((long)&pFVar2->val_ + lVar16) != 0) {
          local_2a0._0_8_ = (Fad<double> *)0x0;
          Vector<double>::operator=
                    ((Vector<double> *)((long)&pFVar2->val_ + lVar16),(double *)local_2a0);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        lVar16 = lVar16 + -0x20;
      } while (p_Var10 != &local_278);
    }
    std::
    _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
    ~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
               *)local_280);
    lVar16 = local_1c8;
  }
  dVar18 = ABS(local_d0.val_);
  dVar17 = *local_158;
  *local_158 = dVar18;
  *local_188 = lVar16;
  Fad<double>::~Fad(&local_130);
  Fad<double>::~Fad(&local_90);
  Fad<double>::~Fad(&local_70);
  Fad<double>::~Fad(&local_110);
  Fad<double>::~Fad(&local_f0);
  Fad<double>::~Fad(&local_230);
  Fad<double>::~Fad(&local_1e8);
  Fad<double>::~Fad(&local_50);
  Fad<double>::~Fad(&local_180);
  Fad<double>::~Fad(&local_d0);
  return dVar18 < dVar17;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigenvaluesJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> * Sort){
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols()){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	int64_t iter = 0;
	TVar res = (TVar)2. * (TVar)tol;
	const int64_t size = this->Rows();
	int64_t i, j;
	int64_t p = -1, q = -1;
	TVar maxval, theta, cost, sint, aux, aux2, Spp, Sqq, Spq;
	while (iter < numiterations){
		/** First of all find the max value off diagonal */
		maxval = 0.;
		for(i = 0; i < size; i++){
			for(j = 0; j < i; j++) {
				if( fabs(this->operator ( )(i,j) ) > fabs(maxval) ) {
					p = i;
					q = j;
					maxval = fabs( this->operator ( )(i,j) );
				}//if
			}//for j
		}//for i
		
		/** Check if max value off diagonal is lesser than required tolerance */
		res = maxval;
		if ((REAL)(fabs(res)) < tol) break;
		
		/** Compute angle of rotation */
		theta = (TVar)0.5 * atan((TVar)2. * this->operator ( )(p,q) / (this->operator ( )(q,q) - this->operator ( )(p,p) ) );
		cost = cos(theta);
		sint = sin(theta);
		
		/** Apply rotation */
		for(i = 0; i < size; i++){
			if (i != p && i != q){
				
				aux = this->operator ( )(i,p) * (TVar)cost - this->operator ( )(i,q) * (TVar)sint;
				aux2 = this->operator ( )(i,p) * (TVar)sint + this->operator ( )(i,q) * (TVar)cost;
				
				this->operator ( )(i,p) = aux;
				this->operator ( )(p,i) = aux;
				
				this->operator ( )(i,q) = aux2;
				this->operator ( )(q,i) = aux2;
				
			}//if
		}//for i
		
		Spp = this->operator ( )(p,p) * cost * cost -(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * sint * sint;
		Sqq = this->operator ( )(p,p) * sint * sint +(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * cost * cost;
		Spq = ( this->operator ( )(p,p) - this->operator ( )(q,q) ) * cost * sint + this->operator ( )(p,q)*( cost*cost - sint*sint );
		
		this->operator ( )(p,p) = Spp;
		this->operator ( )(q,q) = Sqq;
		this->operator ( )(p,q) = Spq;
		this->operator ( )(q,p) = Spq;
		
		iter++;
	}//while
	
	/** Sorting */
	if (Sort){
		multiset< REAL > myset;
		for(i = 0; i < size; i++)
        {   TVar exps = this->operator ( )(i,i);
            myset.insert( (TPZExtractVal::val(exps)) );
        }
		
#ifdef PZDEBUG2
		if ((int64_t)myset.size() != size) PZError << __PRETTY_FUNCTION__ << " - ERROR!" << endl;
#endif
		
		Sort->Resize(size);
		multiset< REAL >::iterator w, e = myset.end();
		for(i = size - 1, w = myset.begin(); w != e; w++, i--){
			Sort->operator [ ](i) = *w;
		}//for
	}//if (Sort)
	
	
	if ((REAL)(fabs(res)) < tol){
		tol = fabs(res);
		numiterations = iter;
		return true;
	}
	
	tol = fabs(res);
	numiterations = iter;
	return false;
	
}